

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

CurrencyAmount * __thiscall
icu_63::NumberFormat::parseCurrency(NumberFormat *this,UnicodeString *text,ParsePosition *pos)

{
  int iVar1;
  CurrencyAmount *this_00;
  char16_t *size;
  UChar curr [4];
  Formattable parseResult;
  UErrorCode local_bc;
  ConstChar16Ptr local_b8;
  char16_t *local_b0;
  char16_t local_a0 [4];
  Formattable local_98;
  
  Formattable::Formattable(&local_98);
  iVar1 = pos->index;
  (*(this->super_Format).super_UObject._vptr_UObject[0x14])(this,text,&local_98,pos);
  if (pos->index != iVar1) {
    local_bc = U_ZERO_ERROR;
    size = local_a0;
    (*(this->super_Format).super_UObject._vptr_UObject[0x24])(this);
    if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) {
      this_00 = (CurrencyAmount *)UMemory::operator_new((UMemory *)0x80,(size_t)size);
      if (this_00 != (CurrencyAmount *)0x0) {
        local_b8.p_ = local_a0;
        CurrencyAmount::CurrencyAmount(this_00,&local_98,&local_b8,&local_bc);
      }
      if (U_ZERO_ERROR < local_bc || this_00 != (CurrencyAmount *)0x0) {
        if (this_00 != (CurrencyAmount *)0x0) {
          local_b0 = local_b8.p_;
          if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002a635e;
          pos->index = iVar1;
          (*(this_00->super_Measure).super_UObject._vptr_UObject[1])(this_00);
          goto LAB_002a635b;
        }
        if (local_bc < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002a635e;
      }
      pos->index = iVar1;
    }
  }
LAB_002a635b:
  this_00 = (CurrencyAmount *)0x0;
LAB_002a635e:
  Formattable::~Formattable(&local_98);
  return this_00;
}

Assistant:

CurrencyAmount* NumberFormat::parseCurrency(const UnicodeString& text,
                                            ParsePosition& pos) const {
    // Default implementation only -- subclasses should override
    Formattable parseResult;
    int32_t start = pos.getIndex();
    parse(text, parseResult, pos);
    if (pos.getIndex() != start) {
        UChar curr[4];
        UErrorCode ec = U_ZERO_ERROR;
        getEffectiveCurrency(curr, ec);
        if (U_SUCCESS(ec)) {
            LocalPointer<CurrencyAmount> currAmt(new CurrencyAmount(parseResult, curr, ec), ec);
            if (U_FAILURE(ec)) {
                pos.setIndex(start); // indicate failure
            } else {
                return currAmt.orphan();
            }
        }
    }
    return NULL;
}